

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O0

hbtrie_result hbtrie_next_partial(hbtrie_iterator *it,void *key_buf,size_t *keylen,void *value_buf)

{
  list_elem *plVar1;
  void *in_RCX;
  size_t *in_RDX;
  void *in_RSI;
  hbtrie_iterator *in_RDI;
  btreeit_item *item;
  list_elem *e;
  hbtrie_result hr;
  btreeit_item *local_40;
  hbtrie_result local_4;
  
  if (((in_RDI->flags & 1) == 0) && ((in_RDI->flags & 2) != 0)) {
    local_4 = HBTRIE_RESULT_FAIL;
  }
  else {
    plVar1 = list_begin(&in_RDI->btreeit_list);
    local_40 = (btreeit_item *)0x0;
    if (plVar1 != (list_elem *)0x0) {
      local_40 = (btreeit_item *)(plVar1 + -7);
    }
    local_4 = _hbtrie_next(in_RDI,local_40,in_RSI,in_RDX,in_RCX,'\x02');
    in_RDI->flags = in_RDI->flags & 0xfe;
    if (local_4 == HBTRIE_RESULT_SUCCESS) {
      in_RDI->flags = in_RDI->flags & 0xfd;
      in_RDI->flags = in_RDI->flags | 4;
    }
    else {
      in_RDI->flags = in_RDI->flags | 2;
    }
  }
  return local_4;
}

Assistant:

hbtrie_result hbtrie_next_partial(struct hbtrie_iterator *it,
                                  void *key_buf,
                                  size_t *keylen,
                                  void *value_buf)
{
    hbtrie_result hr;

    if (HBTRIE_ITR_IS_FWD(it) && HBTRIE_ITR_IS_FAILED(it)) {
        return HBTRIE_RESULT_FAIL;
    }

    struct list_elem *e = list_begin(&it->btreeit_list);
    struct btreeit_item *item = NULL;
    if (e) item = _get_entry(e, struct btreeit_item, le);

    hr = _hbtrie_next(it, item, key_buf, keylen, value_buf, HBTRIE_PARTIAL_MATCH);
    HBTRIE_ITR_SET_FWD(it);
    if (hr == HBTRIE_RESULT_SUCCESS) {
        HBTRIE_ITR_CLR_FAILED(it);
        HBTRIE_ITR_SET_MOVED(it);
    } else {
        HBTRIE_ITR_SET_FAILED(it);
    }
    return hr;
}